

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O0

string * __thiscall
FIX::HttpMessage::toString_abi_cxx11_(string *__return_storage_ptr__,HttpMessage *this)

{
  string *psVar1;
  undefined1 local_38 [8];
  string str;
  HttpMessage *this_local;
  
  str.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  psVar1 = toString(this,(string *)local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpMessage::toString() const
{
  std::string str;
  return toString( str );
}